

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * xmlHashLookup3(xmlHashTablePtr table,xmlChar *name,xmlChar *name2,xmlChar *name3)

{
  int iVar1;
  unsigned_long uVar2;
  _xmlHashEntry *local_40;
  xmlHashEntryPtr entry;
  unsigned_long key;
  xmlChar *name3_local;
  xmlChar *name2_local;
  xmlChar *name_local;
  xmlHashTablePtr table_local;
  
  if (((table != (xmlHashTablePtr)0x0) && (name != (xmlChar *)0x0)) &&
     (uVar2 = xmlHashComputeKey(table,name,name2,name3), table->table[uVar2].valid != 0)) {
    if (table->dict != (xmlDictPtr)0x0) {
      for (local_40 = table->table + uVar2; local_40 != (_xmlHashEntry *)0x0;
          local_40 = local_40->next) {
        if (((local_40->name == name) && (local_40->name2 == name2)) && (local_40->name3 == name3))
        {
          return local_40->payload;
        }
      }
    }
    for (local_40 = table->table + uVar2; local_40 != (_xmlHashEntry *)0x0;
        local_40 = local_40->next) {
      iVar1 = xmlStrEqual(local_40->name,name);
      if (((iVar1 != 0) && (iVar1 = xmlStrEqual(local_40->name2,name2), iVar1 != 0)) &&
         (iVar1 = xmlStrEqual(local_40->name3,name3), iVar1 != 0)) {
        return local_40->payload;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *
xmlHashLookup3(xmlHashTablePtr table, const xmlChar *name,
	       const xmlChar *name2, const xmlChar *name3) {
    unsigned long key;
    xmlHashEntryPtr entry;

    if (table == NULL)
	return(NULL);
    if (name == NULL)
	return(NULL);
    key = xmlHashComputeKey(table, name, name2, name3);
    if (table->table[key].valid == 0)
	return(NULL);
    if (table->dict) {
	for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	    if ((entry->name == name) &&
		(entry->name2 == name2) &&
		(entry->name3 == name3))
		return(entry->payload);
	}
    }
    for (entry = &(table->table[key]); entry != NULL; entry = entry->next) {
	if ((xmlStrEqual(entry->name, name)) &&
	    (xmlStrEqual(entry->name2, name2)) &&
	    (xmlStrEqual(entry->name3, name3)))
	    return(entry->payload);
    }
    return(NULL);
}